

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O2

MeasurementSystem __thiscall QLocalePrivate::measurementSystem(QLocalePrivate *this)

{
  MeasurementSystem MVar1;
  long lVar2;
  long in_FS_OFFSET;
  undefined8 uStack_40;
  TerritoryLanguage ImperialMeasurementSystems [5];
  
  ImperialMeasurementSystems[0].languageId = 0x4b;
  ImperialMeasurementSystems[0].territoryId = 0xf8;
  ImperialMeasurementSystems[0].system = ImperialSystem;
  ImperialMeasurementSystems[1].languageId = 0x4b;
  ImperialMeasurementSystems[1].territoryId = 0xf7;
  ImperialMeasurementSystems[1].system = ImperialSystem;
  ImperialMeasurementSystems[2].languageId = 0x10e;
  ImperialMeasurementSystems[2].territoryId = 0xf8;
  ImperialMeasurementSystems[2].system = ImperialSystem;
  ImperialMeasurementSystems[3].languageId = 0x66;
  ImperialMeasurementSystems[3].territoryId = 0xf8;
  ImperialMeasurementSystems[3].system = ImperialSystem;
  ImperialMeasurementSystems[4].languageId = 0x4b;
  ImperialMeasurementSystems[4].territoryId = 0xf6;
  ImperialMeasurementSystems[4].system = ImperialUKSystem;
  lVar2 = 4;
  do {
    if (lVar2 == 0x2c) {
      MVar1 = MetricSystem;
LAB_002ddd6c:
      if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
        return MVar1;
      }
      uStack_40 = QLocale::weekdays;
      __stack_chk_fail();
    }
    if ((*(quint16 *)((long)ImperialMeasurementSystems + lVar2 + -4) == this->m_data->m_language_id)
       && (*(quint16 *)((long)ImperialMeasurementSystems + lVar2 + -2) ==
           this->m_data->m_territory_id)) {
      MVar1 = *(MeasurementSystem *)((long)&ImperialMeasurementSystems[0].languageId + lVar2);
      goto LAB_002ddd6c;
    }
    lVar2 = lVar2 + 8;
  } while( true );
}

Assistant:

QLocale::MeasurementSystem QLocalePrivate::measurementSystem() const
{
    /* Unicode CLDR's information about measurement systems doesn't say which to
       use by default in each locale. Even if it did, adding another entry in
       every locale's row of locale_data[] would take up much more memory than
       the small table below.
    */
    struct TerritoryLanguage
    {
        quint16 languageId;
        quint16 territoryId;
        QLocale::MeasurementSystem system;
    };
    // TODO: research how realistic and/or complete this is:
    constexpr TerritoryLanguage ImperialMeasurementSystems[] = {
        { QLocale::English, QLocale::UnitedStates, QLocale::ImperialUSSystem },
        { QLocale::English, QLocale::UnitedStatesMinorOutlyingIslands, QLocale::ImperialUSSystem },
        { QLocale::Spanish, QLocale::UnitedStates, QLocale::ImperialUSSystem },
        { QLocale::Hawaiian, QLocale::UnitedStates, QLocale::ImperialUSSystem },
        { QLocale::English, QLocale::UnitedKingdom, QLocale::ImperialUKSystem }
    };

    for (const auto &system : ImperialMeasurementSystems) {
        if (system.languageId == m_data->m_language_id
            && system.territoryId == m_data->m_territory_id) {
            return system.system;
        }
    }
    return QLocale::MetricSystem;
}